

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptSymbol * __thiscall
Js::ScriptContext::GetProperty<Js::JavascriptSymbol>
          (ScriptContext *this,PropertyId propertyId,PropertyRecord *propertyRecord)

{
  undefined8 local_40;
  JavascriptSymbol *prop;
  PropertyRecord *propertyRecord_local;
  PropertyId propertyId_local;
  ScriptContext *this_local;
  
  this_local = (ScriptContext *)TryGetProperty<Js::JavascriptSymbol>(this,propertyId);
  if (this_local == (ScriptContext *)0x0) {
    local_40 = propertyRecord;
    if (propertyRecord == (PropertyRecord *)0x0) {
      local_40 = GetPropertyName(this,propertyId);
    }
    this_local = (ScriptContext *)
                 CreateAndCacheSymbolOrPropertyString<Js::JavascriptSymbol>(this,local_40);
  }
  return (JavascriptSymbol *)this_local;
}

Assistant:

TProperty* ScriptContext::GetProperty(PropertyId propertyId, const PropertyRecord* propertyRecord)
    {
        TProperty *prop = TryGetProperty<TProperty>(propertyId);
        if (prop != nullptr)
        {
            return prop;
        }

        propertyRecord = propertyRecord ? propertyRecord : this->GetPropertyName(propertyId);
        return CreateAndCacheSymbolOrPropertyString<TProperty>(propertyRecord);
    }